

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp.c
# Opt level: O2

MPP_RET get_packet(Kmpp *ctx,MppPacket *packet)

{
  int iVar1;
  uint __i;
  uint uVar2;
  MPP_RET MVar3;
  long lVar4;
  long *param;
  void *__dest;
  MppMeta meta;
  char *fmt;
  MppPacket pvVar5;
  ulong size;
  MppPacket pkt;
  MppPacket local_d0;
  timeval timeout;
  fd_set read_fds;
  
  if (ctx == (Kmpp *)0x0) {
    MVar3 = MPP_ERR_VALUE;
  }
  else if (ctx->mInitDone == 0) {
    MVar3 = MPP_ERR_INIT;
  }
  else {
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      read_fds.__fds_bits[lVar4] = 0;
    }
    iVar1 = ctx->mClientFd;
    read_fds.__fds_bits[iVar1 / 0x40] =
         read_fds.__fds_bits[iVar1 / 0x40] | 1L << ((byte)iVar1 & 0x3f);
    timeout.tv_sec = (ctx->mTimeout).tv_sec;
    timeout.tv_usec = (ctx->mTimeout).tv_usec;
    uVar2 = select(iVar1 + 1,(fd_set *)&read_fds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&timeout);
    if ((int)uVar2 < 1) {
      fmt = "get venc stream error %d\n";
    }
    else {
      if (((ulong)read_fds.__fds_bits[ctx->mClientFd / 0x40] >>
           ((long)ctx->mClientFd % 0x40 & 0x3fU) & 1) == 0) {
        return MPP_OK;
      }
      param = (long *)mpp_mem_pool_get_f("get_packet",ctx->mVencPacketPool);
      MVar3 = mpp_vcodec_ioctl(ctx->mClientFd,0x601,0,0xb8,param);
      if (MVar3 == MPP_OK) {
        size = (ulong)*(uint *)(param + 2);
        if (size == 0) {
          return MPP_OK;
        }
        pkt = (MppPacket)0x0;
        lVar4 = *param;
        if (lVar4 == 0) {
          pkt = (MppPacket)0x0;
        }
        else {
          pvVar5 = ctx->mPacket;
          if (pvVar5 == (MppPacket)0x0) {
            mpp_packet_init(&pkt,(void *)(lVar4 + (ulong)*(uint *)(param + 6)),size);
            mpp_packet_set_release(pkt,kmpp_release_venc_packet,ctx,param);
            pvVar5 = pkt;
          }
          else {
            ctx->mPacket = (MppPacket)0x0;
            pkt = pvVar5;
            local_d0 = pvVar5;
            __dest = mpp_packet_get_pos(pvVar5);
            memcpy(__dest,(void *)(lVar4 + (ulong)*(uint *)(param + 6)),size);
            mpp_vcodec_ioctl(ctx->mClientFd,0x602,0,0xb8,param);
            mpp_packet_set_length(local_d0,size);
            mpp_mem_pool_put_f("get_packet",ctx->mVencPacketPool,param);
            pvVar5 = local_d0;
          }
          mpp_packet_set_dts(pvVar5,param[4]);
          mpp_packet_set_pts(pkt,param[3]);
          mpp_packet_set_flag(pkt,*(RK_U32 *)(param + 5));
          if ((*(byte *)(param + 5) & 0x10) != 0) {
            meta = mpp_packet_get_meta(pkt);
            mpp_meta_set_s32(meta,KEY_OUTPUT_INTRA,1);
          }
        }
        *packet = pkt;
        return MPP_OK;
      }
      uVar2 = ctx->mChanId;
      fmt = "chan %d VCODEC_CHAN_OUT_STRM_BUF_RDY failed\n";
    }
    _mpp_log_l(2,"kmpp",fmt,(char *)0x0,(ulong)uVar2);
    MVar3 = MPP_NOK;
  }
  return MVar3;
}

Assistant:

static MPP_RET get_packet(Kmpp *ctx, MppPacket *packet)
{
    RK_S32 ret;

    if (!ctx)
        return MPP_ERR_VALUE;

    if (!ctx->mInitDone)
        return MPP_ERR_INIT;

    struct timeval timeout;
    fd_set read_fds;

    FD_ZERO(&read_fds);
    FD_SET(ctx->mClientFd, &read_fds);

    memcpy(&timeout, &ctx->mTimeout, sizeof(timeout));
    ret = select(ctx->mClientFd + 1, &read_fds, NULL, NULL, &timeout);
    if (ret <= 0) {
        mpp_err("get venc stream error %d\n", ret);
        return MPP_NOK;
    }

    if (FD_ISSET(ctx->mClientFd, &read_fds)) {
        VencPacket *venc_packet = mpp_mem_pool_get(ctx->mVencPacketPool);

        ret = mpp_vcodec_ioctl(ctx->mClientFd, VCODEC_CHAN_OUT_STRM_BUF_RDY, 0, sizeof(VencPacket), venc_packet);
        if (ret) {
            mpp_err("chan %d VCODEC_CHAN_OUT_STRM_BUF_RDY failed\n", ctx->mChanId);
            return MPP_NOK;
        }

        if (venc_packet->len) {
            MppPacket pkt = NULL;
            void *ptr = NULL;
            RK_U32 len = venc_packet->len;

            ptr = (void *)(intptr_t)(venc_packet->u64priv_data);

            if (ptr) {
                if (ctx->mPacket) {
                    void *dst;

                    pkt = ctx->mPacket;
                    ctx->mPacket = NULL;
                    dst = mpp_packet_get_pos(pkt);
                    memcpy(dst, ptr + venc_packet->offset, len);
                    mpp_vcodec_ioctl(ctx->mClientFd, VCODEC_CHAN_OUT_STRM_END, 0, sizeof(VencPacket), venc_packet);
                    mpp_packet_set_length(pkt, len);
                    mpp_mem_pool_put(ctx->mVencPacketPool, venc_packet);
                } else {
                    mpp_packet_init(&pkt, ptr + venc_packet->offset, len);
                    mpp_packet_set_release(pkt, kmpp_release_venc_packet, ctx, venc_packet);
                }
                mpp_packet_set_dts(pkt, venc_packet->u64dts);
                mpp_packet_set_pts(pkt, venc_packet->u64pts);
                mpp_packet_set_flag(pkt, venc_packet->flag);
                if (venc_packet->flag & MPP_PACKET_FLAG_INTRA) {
                    MppMeta meta = mpp_packet_get_meta(pkt);

                    mpp_meta_set_s32(meta, KEY_OUTPUT_INTRA, 1);
                }
            }
            *packet = pkt;
        }
    }

    return MPP_OK;
}